

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O2

void __thiscall
SplitStringTest_random_long_trailing_delim_Test<unsigned_char>::TestBody
          (SplitStringTest_random_long_trailing_delim_Test<unsigned_char> *this)

{
  char *pcVar1;
  AssertHelper local_f0 [8];
  long *local_e8;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
  split_result;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_> delim
  ;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_98;
  RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  data;
  
  make_delim_long<unsigned_char,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&delim,8,'\0');
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  basic_string(&local_98,&delim);
  RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  ::RandomTestData(&data,&local_98,0,0);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string(&local_98);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  append(&data.m_str,&delim);
  std::
  vector<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<>(&data.m_tokens);
  jessilib::
  split<std::vector,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            (&split_result,&data.m_str,&delim);
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::allocator<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>,std::vector<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::allocator<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>>
            ((internal *)&gtest_ar,"split_result","data.m_tokens",&split_result,&data.m_tokens);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xf8,pcVar1);
    testing::internal::AssertHelper::operator=(local_f0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    if (local_e8 != (long *)0x0) {
      (**(code **)(*local_e8 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&split_result);
  RandomTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  ::~RandomTestData(&data);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string(&delim);
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, random_long_trailing_delim) {
	auto delim = make_delim_long<TypeParam>(8);
	RandomTestData<TypeParam> data{ delim };
	data.m_str += delim;
	data.m_tokens.emplace_back();
	std::vector<std::basic_string<TypeParam>> split_result = split(data.m_str, delim);
	EXPECT_EQ(split_result, data.m_tokens);
}